

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

_Bool do_constant_folding_cond_64(uint64_t x,uint64_t y,TCGCond c)

{
  int extraout_EDX;
  uint uVar1;
  uint uVar2;
  
  switch(c) {
  case TCG_COND_LT:
    return (long)x < (long)y;
  case TCG_COND_GE:
    return (long)y <= (long)x;
  case TCG_COND_LTU:
    return x < y;
  case TCG_COND_GEU:
    return y <= x;
  case TCG_COND_EQ:
    return x == y;
  case TCG_COND_NE:
    return x != y;
  case TCG_COND_LE:
    return (long)x <= (long)y;
  case TCG_COND_GT:
    return (long)y < (long)x;
  case TCG_COND_LEU:
    return x <= y;
  case TCG_COND_GTU:
    return y < x;
  }
  do_constant_folding_cond_64_cold_1();
  uVar1 = (uint)y;
  uVar2 = (int)x - 2;
  if ((uVar2 < 0xc) && ((0xfcfU >> (uVar2 & 0x1f) & 1) != 0)) {
    return (0x54aU >> (uVar2 & 0x1f) & 1) != 0;
  }
  do_constant_folding_cond_eq_cold_1();
  if ((0x100 < uVar2) || ((uVar2 & 7) != 0)) {
    __assert_fail("oprsz % 8 == 0 && oprsz <= (8 << SIMD_OPRSZ_BITS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x4f,"uint32_t simd_desc_tricore(uint32_t, uint32_t, int32_t)");
  }
  if ((uVar1 < 0x101) && ((uVar1 & 7) == 0)) {
    if (extraout_EDX + 0x200000U < 0x400000) {
      return (_Bool)((char)uVar1 * '\x04' - 0x20U & 0xe0 | (char)(uVar2 >> 3) - 1U & 0x1f);
    }
    __assert_fail("data == sextract32(data, 0, SIMD_DATA_BITS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x51,"uint32_t simd_desc_tricore(uint32_t, uint32_t, int32_t)");
  }
  __assert_fail("maxsz % 8 == 0 && maxsz <= (8 << SIMD_MAXSZ_BITS)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                ,0x50,"uint32_t simd_desc_tricore(uint32_t, uint32_t, int32_t)");
}

Assistant:

static bool do_constant_folding_cond_64(uint64_t x, uint64_t y, TCGCond c)
{
    switch (c) {
    case TCG_COND_EQ:
        return x == y;
    case TCG_COND_NE:
        return x != y;
    case TCG_COND_LT:
        return (int64_t)x < (int64_t)y;
    case TCG_COND_GE:
        return (int64_t)x >= (int64_t)y;
    case TCG_COND_LE:
        return (int64_t)x <= (int64_t)y;
    case TCG_COND_GT:
        return (int64_t)x > (int64_t)y;
    case TCG_COND_LTU:
        return x < y;
    case TCG_COND_GEU:
        return x >= y;
    case TCG_COND_LEU:
        return x <= y;
    case TCG_COND_GTU:
        return x > y;
    default:
        tcg_abort();
    }
}